

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::RepeatGreedyLoopNoBacktrackInst::Exec
          (RepeatGreedyLoopNoBacktrackInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  CharCount CVar1;
  code *pcVar2;
  bool bVar3;
  BeginGreedyLoopNoBacktrackInst *pBVar4;
  LoopInfo *pLVar5;
  Cont *pCVar6;
  undefined4 *puVar7;
  uint8 *puVar8;
  
  pBVar4 = Matcher::LabelToInstPointer<UnifiedRegex::BeginGreedyLoopNoBacktrackInst>
                     (matcher,BeginGreedyLoopNoBacktrack,(this->super_RepeatLoopMixin).beginLabel);
  pLVar5 = Matcher::LoopIdToLoopInfo(matcher,(pBVar4->super_GreedyLoopNoBacktrackMixin).loopId);
  pLVar5->number = pLVar5->number + 1;
  if (*inputOffset == pLVar5->startInputOffset) {
    bVar3 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks);
  }
  else {
    pCVar6 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::Top
                       (&contStack->
                         super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    if ((pCVar6 == (Cont *)0x0) || (pCVar6->tag != Resume)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0xe9c,"(top != 0 && top->tag == Cont::ContTag::Resume)",
                         "top != 0 && top->tag == Cont::ContTag::Resume");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    CVar1 = *inputOffset;
    *(CharCount *)&pCVar6->field_0xc = CVar1;
    pLVar5->startInputOffset = CVar1;
    puVar8 = Matcher::LabelToInstPointer(matcher,(this->super_RepeatLoopMixin).beginLabel + 9);
    *instPointer = puVar8;
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

inline bool RepeatGreedyLoopNoBacktrackInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginGreedyLoopNoBacktrackInst* begin = matcher.L2I(BeginGreedyLoopNoBacktrack, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        loopInfo->number++;

        if (inputOffset == loopInfo->startInputOffset)
        {
            // No progress
            return matcher.Fail(FAIL_PARAMETERS);
        }
        else
        {
            // CHOICEPOINT: Try one more iteration of body, if backtrack, continue from here with no more iterations.
            // Since the loop body is deterministic and group free, it wouldn't have left any continuation records.
            // Therefore we can simply update the Resume continuation still on the top of the stack with the current
            // input pointer.
            Cont* top = contStack.Top();
            Assert(top != 0 && top->tag == Cont::ContTag::Resume);
            ResumeCont* resume = (ResumeCont*)top;
            resume->origInputOffset = inputOffset;

            loopInfo->startInputOffset = inputOffset;
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginGreedyLoopNoBacktrackInst));
        }
        return false;
    }